

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O1

void __thiscall
spvtools::opt::LoopUtils::PopulateLoopDesc
          (LoopUtils *this,Loop *new_loop,Loop *old_loop,LoopCloningResult *cloning_result)

{
  BlockMapTy *this_00;
  Instruction *pIVar1;
  ulong uVar2;
  uint32_t uVar3;
  undefined8 in_RAX;
  mapped_type *ppBVar4;
  _Hash_node_base *p_Var5;
  ulong uVar6;
  BasicBlock **ppBVar7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  uint32_t bb_id;
  undefined8 uStack_38;
  
  p_Var5 = (old_loop->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
  uStack_38 = in_RAX;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    do {
      uStack_38 = CONCAT44(*(undefined4 *)&p_Var5[1]._M_nxt,(undefined4)uStack_38);
      ppBVar4 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&cloning_result->old_to_new_bb_,(key_type *)((long)&uStack_38 + 4));
      Loop::AddBasicBlock(new_loop,*ppBVar4);
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  this_00 = &cloning_result->old_to_new_bb_;
  pIVar1 = (old_loop->loop_header_->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar3 = 0;
  if (pIVar1->has_result_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
  }
  uStack_38 = CONCAT44(uVar3,(undefined4)uStack_38);
  ppBVar4 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)this_00,(key_type *)((long)&uStack_38 + 4));
  new_loop->loop_header_ = *ppBVar4;
  if (old_loop->loop_latch_ != (BasicBlock *)0x0) {
    pIVar1 = (old_loop->loop_latch_->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    uVar3 = 0;
    if (pIVar1->has_result_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
    }
    uStack_38 = CONCAT44(uVar3,(undefined4)uStack_38);
    ppBVar4 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)this_00,(key_type *)((long)&uStack_38 + 4));
    Loop::SetLatchBlock(new_loop,*ppBVar4);
  }
  if (old_loop->loop_continue_ != (BasicBlock *)0x0) {
    pIVar1 = (old_loop->loop_continue_->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    uVar3 = 0;
    if (pIVar1->has_result_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
    }
    uStack_38 = CONCAT44(uVar3,(undefined4)uStack_38);
    ppBVar4 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)this_00,(key_type *)((long)&uStack_38 + 4));
    Loop::SetContinueBlock(new_loop,*ppBVar4);
  }
  if (old_loop->loop_merge_ != (BasicBlock *)0x0) {
    pIVar1 = (old_loop->loop_merge_->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    uVar3 = 0;
    if (pIVar1->has_result_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
    }
    uVar2 = (cloning_result->old_to_new_bb_)._M_h._M_bucket_count;
    uVar6 = (ulong)uVar3 % uVar2;
    p_Var8 = (cloning_result->old_to_new_bb_)._M_h._M_buckets[uVar6];
    p_Var9 = (__node_base_ptr)0x0;
    if ((p_Var8 != (__node_base_ptr)0x0) &&
       (p_Var5 = p_Var8->_M_nxt, p_Var9 = p_Var8, uVar3 != *(uint *)&p_Var8->_M_nxt[1]._M_nxt)) {
      while (p_Var8 = p_Var5, p_Var5 = p_Var8->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
        p_Var9 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var5[1]._M_nxt % uVar2 != uVar6) ||
           (p_Var9 = p_Var8, uVar3 == *(uint *)&p_Var5[1]._M_nxt)) goto LAB_00254fe9;
      }
      p_Var9 = (__node_base_ptr)0x0;
    }
LAB_00254fe9:
    if (p_Var9 == (__node_base_ptr)0x0) {
      p_Var5 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var5 = p_Var9->_M_nxt;
    }
    ppBVar7 = (BasicBlock **)(p_Var5 + 2);
    if (p_Var5 == (_Hash_node_base *)0x0) {
      ppBVar7 = &old_loop->loop_merge_;
    }
    Loop::SetMergeBlock(new_loop,(BasicBlock *)*ppBVar7);
  }
  if (old_loop->loop_preheader_ != (BasicBlock *)0x0) {
    pIVar1 = (old_loop->loop_preheader_->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    uVar3 = 0;
    if (pIVar1->has_result_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
    }
    uVar2 = (cloning_result->old_to_new_bb_)._M_h._M_bucket_count;
    uVar6 = (ulong)uVar3 % uVar2;
    p_Var8 = (cloning_result->old_to_new_bb_)._M_h._M_buckets[uVar6];
    p_Var9 = (__node_base_ptr)0x0;
    if ((p_Var8 != (__node_base_ptr)0x0) &&
       (p_Var5 = p_Var8->_M_nxt, p_Var9 = p_Var8, uVar3 != *(uint *)&p_Var8->_M_nxt[1]._M_nxt)) {
      while (p_Var8 = p_Var5, p_Var5 = p_Var8->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
        p_Var9 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var5[1]._M_nxt % uVar2 != uVar6) ||
           (p_Var9 = p_Var8, uVar3 == *(uint *)&p_Var5[1]._M_nxt)) goto LAB_0025508b;
      }
      p_Var9 = (__node_base_ptr)0x0;
    }
LAB_0025508b:
    if (p_Var9 == (__node_base_ptr)0x0) {
      p_Var5 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var5 = p_Var9->_M_nxt;
    }
    if (p_Var5 != (_Hash_node_base *)0x0) {
      Loop::SetPreHeaderBlock(new_loop,(BasicBlock *)p_Var5[2]._M_nxt);
    }
  }
  return;
}

Assistant:

void LoopUtils::PopulateLoopDesc(
    Loop* new_loop, Loop* old_loop,
    const LoopCloningResult& cloning_result) const {
  for (uint32_t bb_id : old_loop->GetBlocks()) {
    BasicBlock* bb = cloning_result.old_to_new_bb_.at(bb_id);
    new_loop->AddBasicBlock(bb);
  }
  new_loop->SetHeaderBlock(
      cloning_result.old_to_new_bb_.at(old_loop->GetHeaderBlock()->id()));
  if (old_loop->GetLatchBlock())
    new_loop->SetLatchBlock(
        cloning_result.old_to_new_bb_.at(old_loop->GetLatchBlock()->id()));
  if (old_loop->GetContinueBlock())
    new_loop->SetContinueBlock(
        cloning_result.old_to_new_bb_.at(old_loop->GetContinueBlock()->id()));
  if (old_loop->GetMergeBlock()) {
    auto it =
        cloning_result.old_to_new_bb_.find(old_loop->GetMergeBlock()->id());
    BasicBlock* bb = it != cloning_result.old_to_new_bb_.end()
                         ? it->second
                         : old_loop->GetMergeBlock();
    new_loop->SetMergeBlock(bb);
  }
  if (old_loop->GetPreHeaderBlock()) {
    auto it =
        cloning_result.old_to_new_bb_.find(old_loop->GetPreHeaderBlock()->id());
    if (it != cloning_result.old_to_new_bb_.end()) {
      new_loop->SetPreHeaderBlock(it->second);
    }
  }
}